

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O2

matches * atombf_a(iasctx *ctx,void *v,int spos)

{
  int iVar1;
  litem *plVar2;
  easm_expr *peVar3;
  ull num;
  uint64_t uVar4;
  int iVar5;
  matches *pmVar6;
  match *__ptr;
  int iVar7;
  match res;
  
  if ((ctx->atomsnum != spos) && (plVar2 = ctx->atoms[spos], plVar2->type == LITEM_EXPR)) {
    memset(&res,0,0xb8);
    res.lpos = spos + 1;
    peVar3 = plVar2->expr;
    if (peVar3->type != EASM_EXPR_VEC) {
      return (matches *)0x0;
    }
    if ((peVar3->e1->type == EASM_EXPR_NUM) && (peVar3->e2->type == EASM_EXPR_NUM)) {
      num = peVar3->e1->num;
      uVar4 = peVar3->e2->num;
      iVar5 = setbf(&res,(bitfield *)v,num);
      if ((iVar5 != 0) && (iVar5 = setbf(&res,(bitfield *)((long)v + 0x30),uVar4 - num), iVar5 != 0)
         ) {
        pmVar6 = emptymatches();
        iVar5 = pmVar6->mnum;
        iVar1 = pmVar6->mmax;
        __ptr = pmVar6->m;
        if (iVar1 <= iVar5) {
          iVar7 = 0x10;
          if (iVar1 != 0) {
            iVar7 = iVar1 * 2;
          }
          pmVar6->mmax = iVar7;
          __ptr = (match *)realloc(__ptr,(long)iVar7 * 0xb8);
          pmVar6->m = __ptr;
        }
        pmVar6->mnum = iVar5 + 1;
        memcpy(__ptr + iVar5,&res,0xb8);
        return pmVar6;
      }
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atombf_a APROTO {
	const struct bitfield *bf = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct match res = { 0, .lpos = spos+1 };
	const struct easm_expr *expr = ctx->atoms[spos]->expr;
	if (expr->type != EASM_EXPR_VEC || expr->e1->type != EASM_EXPR_NUM || expr->e2->type != EASM_EXPR_NUM)
		return 0;
	uint64_t a = expr->e1->num;
	uint64_t b = expr->e2->num - a;
	if (!setbf(&res, &bf[0], a))
		return 0;
	if (!setbf(&res, &bf[1], b))
		return 0;
	struct matches *rres = emptymatches();
	ADDARRAY(rres->m, res);
	return rres;
}